

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void __thiscall
Test_Template_TemplateSearchPath::Test_Template_TemplateSearchPath
          (Test_Template_TemplateSearchPath *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(Template, TemplateSearchPath) {
  const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
  const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
  CreateOrCleanTestDir(pathA);
  CreateOrCleanTestDir(pathB);

  TemplateDictionary dict("");
  Template::SetTemplateRootDirectory(pathA);
  Template::AddAlternateTemplateRootDirectory(pathB);

  // 1. Show that a template in the secondary path can be found.
  const string path_b_bar = PathJoin(pathB, "template_bar");
  StringToFile("b/template_bar", path_b_bar);
  ASSERT_STREQ(path_b_bar.c_str(),
               Template::FindTemplateFilename("template_bar").c_str());
  Template* b_bar = Template::GetTemplate("template_bar", DO_NOT_STRIP);
  ASSERT(b_bar);
  AssertExpandIs(b_bar, &dict, "b/template_bar", true);

  // 2. Show that the search stops once the first match is found.
  //    Create two templates in separate directories with the same name.
  const string path_a_foo = PathJoin(pathA, "template_foo");
  StringToFile("a/template_foo", path_a_foo);
  StringToFile("b/template_foo", PathJoin(pathB, "template_foo"));
  ASSERT_STREQ(path_a_foo.c_str(),
               Template::FindTemplateFilename("template_foo").c_str());
  Template* a_foo = Template::GetTemplate("template_foo", DO_NOT_STRIP);
  ASSERT(a_foo);
  AssertExpandIs(a_foo, &dict, "a/template_foo", true);

  // 3. Show that attempting to find a non-existent template gives an
  //    empty path.
  ASSERT(Template::FindTemplateFilename("baz").empty());

  CreateOrCleanTestDir(pathA);
  CreateOrCleanTestDir(pathB);
}